

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_unitsNotEqualDifferingUnitsBasic_Test::TestBody
          (Equality_unitsNotEqualDifferingUnitsBasic_Test *this)

{
  string *psVar1;
  undefined1 uVar2;
  char cVar3;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  long *local_88;
  AssertionResult local_80;
  long local_70 [2];
  AssertHelper local_60 [8];
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48 [2];
  string *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_80._0_8_ = (string *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"unitsA","");
  libcellml::Units::create((string *)&local_28);
  if ((string *)local_80._0_8_ != (string *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  local_80._0_8_ = (string *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"unitsA","");
  libcellml::Units::create((string *)&local_38);
  if ((string *)local_80._0_8_ != (string *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  psVar1 = local_28;
  local_80._0_8_ = (string *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"second","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unit_id","");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_80);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((string *)local_80._0_8_ != (string *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  psVar1 = local_38;
  local_80._0_8_ = (string *)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"second","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unit_id","");
  libcellml::Units::addUnit(psVar1,2.0,(string *)&local_80);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((string *)local_80._0_8_ != (string *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  local_80._0_8_ = local_38;
  local_80.message_.ptr_ = local_30;
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
    }
  }
  uVar2 = libcellml::Entity::equals((shared_ptr *)local_28);
  local_58 = (long *)(CONCAT71(local_58._1_7_,uVar2) ^ 1);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.message_.ptr_);
  }
  if (local_58._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_58,"u1->equals(u2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x121,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((string *)local_80._0_8_ != (string *)local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80._0_8_ = local_28;
  local_80.message_.ptr_ = local_20;
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_20->_M_string_length = (int)local_20->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_20->_M_string_length = (int)local_20->_M_string_length + 1;
    }
  }
  uVar2 = libcellml::Entity::equals((shared_ptr *)local_38);
  local_58 = (long *)(CONCAT71(local_58._1_7_,uVar2) ^ 1);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.message_.ptr_);
  }
  if (local_58._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_58,"u2->equals(u1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x122,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((string *)local_80._0_8_ != (string *)local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}